

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# data_type.hpp
# Opt level: O1

DataType csv::internals::data_type(string_view in,longdouble *out,char decimalSymbol)

{
  byte bVar1;
  ulong uVar2;
  bool bVar3;
  bool bVar4;
  DataType in_EAX;
  DataType DVar5;
  DataType DVar6;
  undefined7 in_register_00000009;
  uint uVar7;
  undefined7 uVar10;
  longdouble *plVar8;
  ulong uVar9;
  longdouble *extraout_RDX;
  undefined8 unaff_RBX;
  ulong uVar11;
  longdouble *plVar12;
  char *pcVar13;
  longdouble *plVar14;
  char *pcVar15;
  longdouble *in_R8;
  bool bVar16;
  longdouble lVar17;
  longdouble lVar18;
  longdouble lVar19;
  longdouble lVar20;
  string_view in_00;
  string_view exponential_part;
  longdouble lStack_b0;
  ulong uStack_98;
  longdouble *plStack_90;
  uint local_84;
  uint local_80;
  undefined4 local_7c;
  ulong local_78;
  ulong local_70;
  undefined4 local_68;
  longdouble local_64;
  longdouble local_58;
  uint local_4c;
  longdouble local_48;
  
  pcVar13 = in._M_str;
  plVar14 = (longdouble *)in._M_len;
  local_68 = (undefined4)CONCAT71(in_register_00000009,decimalSymbol);
  if (plVar14 != (longdouble *)0x0) {
    local_64 = (longdouble)0;
    bVar16 = true;
    uVar11 = CONCAT71((int7)((ulong)unaff_RBX >> 8),1);
    uVar10 = (undefined7)((ulong)out >> 8);
    local_7c = (undefined4)CONCAT71(uVar10,1);
    local_80 = (uint)CONCAT71(uVar10,1);
    local_70 = 0;
    plVar12 = (longdouble *)0x0;
    local_78 = 0;
    bVar4 = false;
    local_84 = 0;
    local_58 = local_64;
    do {
      bVar1 = pcVar13[(long)plVar12];
      if (bVar1 < 0x2d) {
        if (bVar1 == 0x20) {
          if ((uVar11 & 1) == 0) {
            bVar3 = false;
            if (9 < (int)(pcVar13 + -1)[(long)plVar12] - 0x30U) {
              in_EAX = CSV_STRING;
              goto LAB_0010c8aa;
            }
            uVar11 = CONCAT71((int7)(uVar11 >> 8),1);
            local_80 = 0;
          }
        }
        else {
          if (bVar1 != 0x2b) goto LAB_0010c7d3;
          if ((char)uVar11 == '\0') goto LAB_0010c79d;
        }
LAB_0010c8a4:
        bVar3 = true;
      }
      else {
        if (bVar1 == 0x2d) {
          if ((uVar11 & 1) != 0) {
            local_70 = 1;
            goto LAB_0010c8a4;
          }
LAB_0010c79d:
          in_EAX = CSV_STRING;
        }
        else if ((bVar1 == 0x45) || (bVar1 == 0x65)) {
          if ((bVar4) ||
             ((in_EAX = CSV_STRING,
              (longdouble *)((long)plVar12 + 1U) < plVar14 && plVar12 != (longdouble *)0x0 &&
              ((int)(pcVar13 + -1)[(long)plVar12] - 0x30U < 10)))) {
            plVar8 = (longdouble *)((long)plVar12 + 1);
            if ((pcVar13 + 1)[(long)plVar12] == '+') {
              plVar8 = (longdouble *)((long)plVar12 + 2);
            }
            if (plVar14 < plVar8) {
              pcVar15 = "%s: __pos (which is %zu) > __size (which is %zu)";
              pcVar13 = "basic_string_view::substr";
              plStack_90 = (longdouble *)_process_potential_exponential;
              plVar12 = plVar14;
              std::__throw_out_of_range_fmt("%s: __pos (which is %zu) > __size (which is %zu)");
              lStack_b0 = (longdouble)0;
              in_00._M_str = pcVar13;
              in_00._M_len = (size_t)pcVar15;
              uStack_98 = uVar11;
              plStack_90 = plVar14;
              DVar5 = data_type(in_00,&lStack_b0,'.');
              DVar6 = CSV_STRING;
              if (((uint)(DVar5 + ~CSV_STRING) < 5) &&
                 (DVar6 = CSV_DOUBLE, plVar12 != (longdouble *)0x0)) {
                lVar18 = -lStack_b0;
                lVar17 = lVar18;
                if (lVar18 <= lStack_b0 || lStack_b0 != lVar18) {
                  lVar17 = lStack_b0;
                }
                lVar19 = (longdouble)1;
                lVar20 = (longdouble)0;
                if (lVar20 < lVar17) {
                  lVar19 = (longdouble)1;
                  do {
                    lVar19 = lVar19 * *(longdouble *)
                                       (&DAT_0010e7d0 + (ulong)(lVar18 < lStack_b0) * 0x10);
                    lVar20 = lVar20 + (longdouble)1;
                  } while (lVar20 < lVar17);
                }
                *plVar12 = lVar19 * *extraout_RDX;
              }
              return DVar6;
            }
            local_48 = local_64 + local_58;
            if ((local_70 & 1) != 0) {
              local_48 = -(local_64 + local_58);
            }
            plStack_90 = (longdouble *)0x10c735;
            exponential_part._M_str = (char *)&local_48;
            exponential_part._M_len = (size_t)((long)plVar8 + (long)pcVar13);
            in_EAX = _process_potential_exponential
                               ((internals *)((long)plVar14 - (long)plVar8),exponential_part,out,
                                in_R8);
            bVar4 = true;
          }
        }
        else {
LAB_0010c7d3:
          if ((byte)(bVar1 - 0x30) < 10) {
            if ((local_80 & 1) == 0) {
              local_78 = 1;
              goto LAB_0010c883;
            }
            local_4c = (int)(char)bVar1 - 0x30;
            uVar9 = (ulong)local_4c;
            uVar2 = uVar11 & 1;
            uVar11 = uVar11 & 0xff;
            in_R8 = (longdouble *)0x0;
            if (uVar2 != 0) {
              uVar11 = 0;
            }
            if (bVar4) {
              lVar17 = (longdouble)1;
              local_84 = local_84 + 1;
              if (local_84 != 0) {
                uVar9 = (ulong)local_84;
                lVar17 = (longdouble)1;
                do {
                  lVar17 = lVar17 * (longdouble)10.0;
                  uVar7 = (int)uVar9 - 1;
                  uVar9 = (ulong)uVar7;
                } while (uVar7 != 0);
              }
              local_58 = local_58 + (longdouble)(int)local_4c / lVar17;
            }
            else {
              local_64 = local_64 * (longdouble)10.0 + (longdouble)(int)local_4c;
            }
            local_78 = CONCAT71((int7)(uVar9 >> 8),1);
LAB_0010c89e:
            bVar3 = true;
          }
          else {
            if (bVar1 == (byte)local_68 && (~(byte)local_7c & 1) == 0) {
              bVar4 = true;
              local_7c = 0;
              goto LAB_0010c89e;
            }
LAB_0010c883:
            in_EAX = CSV_STRING;
            bVar3 = false;
          }
          if (bVar3) goto LAB_0010c8a4;
        }
        bVar3 = false;
      }
LAB_0010c8aa:
      if (!bVar3) break;
      plVar12 = (longdouble *)((long)plVar12 + 1);
      bVar16 = plVar12 < plVar14;
    } while (plVar12 != plVar14);
    if (bVar16) {
      return in_EAX;
    }
    if ((local_78 & 1) != 0) {
      local_48 = local_64 + local_58;
      if (out != (longdouble *)0x0) {
        lVar17 = local_48;
        if ((local_70 & 1) != 0) {
          lVar17 = -local_48;
        }
        *out = lVar17;
      }
      if (bVar4) {
        return CSV_DOUBLE;
      }
      plStack_90 = (longdouble *)0x10c90c;
      DVar5 = _determine_integral_type(&local_48);
      return DVar5;
    }
  }
  return CSV_NULL;
}

Assistant:

CONSTEXPR_14
        DataType data_type(csv::string_view in, long double* const out, const char decimalSymbol) {
            // Empty string --> NULL
            if (in.size() == 0)
                return DataType::CSV_NULL;

            bool ws_allowed = true,
                dot_allowed = true,
                digit_allowed = true,
                is_negative = false,
                has_digit = false,
                prob_float = false;

            unsigned places_after_decimal = 0;
            long double integral_part = 0,
                decimal_part = 0;

            for (size_t i = 0, ilen = in.size(); i < ilen; i++) {
                const char& current = in[i];

                switch (current) {
                case ' ':
                    if (!ws_allowed) {
                        if (isdigit(in[i - 1])) {
                            digit_allowed = false;
                            ws_allowed = true;
                        }
                        else {
                            // Ex: '510 123 4567'
                            return DataType::CSV_STRING;
                        }
                    }
                    break;
                case '+':
                    if (!ws_allowed) {
                        return DataType::CSV_STRING;
                    }

                    break;
                case '-':
                    if (!ws_allowed) {
                        // Ex: '510-123-4567'
                        return DataType::CSV_STRING;
                    }

                    is_negative = true;
                    break;
                // case decimalSymbol: not allowed because decimalSymbol is not a literal,
                // it is handled in the default block
                case 'e':
                case 'E':
                    // Process scientific notation
                    if (prob_float || (i && i + 1 < ilen && isdigit(in[i - 1]))) {
                        size_t exponent_start_idx = i + 1;
                        prob_float = true;

                        // Strip out plus sign
                        if (in[i + 1] == '+') {
                            exponent_start_idx++;
                        }

                        return _process_potential_exponential(
                            in.substr(exponent_start_idx),
                            is_negative ? -(integral_part + decimal_part) : integral_part + decimal_part,
                            out
                        );
                    }

                    return DataType::CSV_STRING;
                    break;
                default:
                    short digit = static_cast<short>(current - '0');
                    if (digit >= 0 && digit <= 9) {
                        // Process digit
                        has_digit = true;

                        if (!digit_allowed)
                            return DataType::CSV_STRING;
                        else if (ws_allowed) // Ex: '510 456'
                            ws_allowed = false;

                        // Build current number
                        if (prob_float)
                            decimal_part += digit / pow10(++places_after_decimal);
                        else
                            integral_part = (integral_part * 10) + digit;
                    }
                    // case decimalSymbol: not allowed because decimalSymbol is not a literal. 
                    else if (dot_allowed && current == decimalSymbol) {
                        dot_allowed = false;
                        prob_float = true;
                    }
                    else {
                        return DataType::CSV_STRING;
                    }
                }
            }

            // No non-numeric/non-whitespace characters found
            if (has_digit) {
                long double number = integral_part + decimal_part;
                if (out) {
                    *out = is_negative ? -number : number;
                }

                return prob_float ? DataType::CSV_DOUBLE : _determine_integral_type(number);
            }

            // Just whitespace
            return DataType::CSV_NULL;
        }